

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

string * __thiscall
testing::internal::String::FormatHexInt_abi_cxx11_
          (string *__return_storage_ptr__,String *this,int value)

{
  uint *puVar1;
  stringstream ss;
  stringstream asStack_198 [16];
  long local_188 [3];
  uint auStack_170 [22];
  ios_base local_118 [264];
  
  std::__cxx11::stringstream::stringstream(asStack_198);
  *(uint *)((long)auStack_170 + *(long *)(local_188[0] + -0x18)) =
       *(uint *)((long)auStack_170 + *(long *)(local_188[0] + -0x18)) & 0xffffffb5 | 8;
  puVar1 = (uint *)((long)auStack_170 + *(long *)(local_188[0] + -0x18));
  *puVar1 = *puVar1 | 0x4000;
  std::ostream::operator<<((ostream *)local_188,(int)this);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(asStack_198);
  std::ios_base::~ios_base(local_118);
  return __return_storage_ptr__;
}

Assistant:

std::string String::FormatHexInt(int value) {
  std::stringstream ss;
  ss << std::hex << std::uppercase << value;
  return ss.str();
}